

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint local_34;
  
  if (in == (uchar *)0x0 || insize == 0) {
    uVar7 = 0x30;
  }
  else if (insize < 0x21) {
    uVar7 = 0x1b;
  }
  else {
    lodepng_info_cleanup(&state->info_png);
    lodepng_info_init(&state->info_png);
    uVar7 = 0x1c;
    if (((((*in == 0x89) && (in[1] == 'P')) && (in[2] == 'N')) &&
        ((in[3] == 'G' && (in[4] == '\r')))) &&
       ((in[5] == '\n' && ((in[6] == '\x1a' && (in[7] == '\n')))))) {
      uVar7 = lodepng_read32bitInt(in + 8);
      if (uVar7 == 0xd) {
        uVar6 = lodepng_chunk_type_equals(in + 8,"IHDR");
        if (uVar6 == '\0') {
          uVar7 = 0x1d;
        }
        else {
          uVar7 = lodepng_read32bitInt(in + 0x10);
          *w = uVar7;
          uVar7 = lodepng_read32bitInt(in + 0x14);
          *h = uVar7;
          bVar1 = in[0x18];
          (state->info_png).color.bitdepth = (uint)bVar1;
          bVar2 = in[0x19];
          (state->info_png).color.colortype = (uint)bVar2;
          bVar3 = in[0x1a];
          (state->info_png).compression_method = (uint)bVar3;
          bVar4 = in[0x1b];
          (state->info_png).filter_method = (uint)bVar4;
          bVar5 = in[0x1c];
          (state->info_png).interlace_method = (uint)bVar5;
          uVar7 = 0x5d;
          if ((*w != 0) && (*h != 0)) {
            if ((state->decoder).ignore_crc == 0) {
              uVar7 = lodepng_read32bitInt(in + 0x1d);
              uVar8 = lodepng_crc32(in + 0xc,0x11);
              if (uVar7 != uVar8) {
                uVar7 = 0x39;
                goto LAB_002e2cec;
              }
            }
            if (bVar3 == 0) {
              if (bVar4 == 0) {
                if (bVar5 < 2) {
                  local_34 = (uint)bVar1;
                  uVar7 = checkColorValidity((uint)bVar2,local_34);
                }
                else {
                  uVar7 = 0x22;
                }
              }
              else {
                uVar7 = 0x21;
              }
            }
            else {
              uVar7 = 0x20;
            }
          }
        }
      }
      else {
        uVar7 = 0x5e;
      }
    }
  }
LAB_002e2cec:
  state->error = uVar7;
  return uVar7;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize)
{
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0)
  {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33)
  {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10)
  {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(lodepng_chunk_length(in + 8) != 13)
  {
    CERROR_RETURN_ERROR(state->error, 94); /*error: header size must be 13 bytes*/
  }
  if(!lodepng_chunk_type_equals(in + 8, "IHDR"))
  {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  *w = lodepng_read32bitInt(&in[16]);
  *h = lodepng_read32bitInt(&in[20]);
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  if(*w == 0 || *h == 0)
  {
    CERROR_RETURN_ERROR(state->error, 93);
  }

  if(!state->decoder.ignore_crc)
  {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum)
    {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  return state->error;
}